

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O1

void __thiscall intel_acbp_v2_t::_read(intel_acbp_v2_t *this)

{
  header_t *phVar1;
  key_signature_t *pkVar2;
  kstream *pkVar3;
  byte bVar4;
  uint8_t uVar5;
  uint16_t uVar6;
  structure_ids_t sVar7;
  pointer __p;
  acbp_element_t *this_00;
  key_signature_t *this_01;
  validation_not_equal_error<intel_acbp_v2_t::structure_ids_t> *this_02;
  validation_expr_error<unsigned_char> *this_03;
  validation_not_equal_error<unsigned_short> *this_04;
  _Head_base<0UL,_intel_acbp_v2_t::acbp_element_t_*,_false> local_a0;
  structure_ids_t local_98;
  string local_90;
  string local_70;
  string local_50;
  
  sVar7 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_structure_id = sVar7;
  if (sVar7 != STRUCTURE_IDS_ACBP) {
    this_02 = (validation_not_equal_error<intel_acbp_v2_t::structure_ids_t> *)
              __cxa_allocate_exception(0x48);
    local_a0._M_head_impl = (acbp_element_t *)0x5f5f504243415f5f;
    local_98 = this->m_structure_id;
    pkVar3 = (this->super_kstruct).m__io;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/seq/0","");
    kaitai::validation_not_equal_error<intel_acbp_v2_t::structure_ids_t>::validation_not_equal_error
              (this_02,(structure_ids_t *)&local_a0,&local_98,pkVar3,&local_50);
    __cxa_throw(this_02,&kaitai::validation_not_equal_error<intel_acbp_v2_t::structure_ids_t>::
                         typeinfo,kaitai::kstruct_error::~kstruct_error);
  }
  bVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = bVar4;
  if (0x1f < bVar4) {
    uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_header_specific = uVar5;
    uVar6 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
    this->m_total_size = uVar6;
    if (uVar6 == 0x14) {
      uVar6 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
      this->m_key_signature_offset = uVar6;
      uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_bpm_revision = uVar5;
      uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_bp_svn = uVar5;
      uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_acm_svn = uVar5;
      uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_reserved = uVar5;
      uVar6 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
      this->m_nem_data_size = uVar6;
      __p = (pointer)operator_new(0x18);
      (__p->
      super__Vector_base<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->
      super__Vector_base<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->
      super__Vector_base<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      __uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
      ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
               *)&this->m_elements,__p);
      do {
        this_00 = (acbp_element_t *)operator_new(0x70);
        acbp_element_t::acbp_element_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
        local_a0._M_head_impl = this_00;
        std::
        vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>>>
        ::
        emplace_back<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>>
                  ((vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>>>
                    *)(this->m_elements)._M_t.
                      super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
                      .
                      super__Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_*,_false>
                      ._M_head_impl,
                   (unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>
                    *)&local_a0);
        if (local_a0._M_head_impl != (acbp_element_t *)0x0) {
          (*((local_a0._M_head_impl)->super_kstruct)._vptr_kstruct[1])();
        }
        phVar1 = (this_00->m_header)._M_t.
                 super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
                 .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
      } while ((phVar1->m_total_size != 0) && (phVar1->m_structure_id != STRUCTURE_IDS_PMSG));
      this_01 = (key_signature_t *)operator_new(0x40);
      key_signature_t::key_signature_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
      pkVar2 = (this->m_key_signature)._M_t.
               super___uniq_ptr_impl<intel_acbp_v2_t::key_signature_t,_std::default_delete<intel_acbp_v2_t::key_signature_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_intel_acbp_v2_t::key_signature_t_*,_std::default_delete<intel_acbp_v2_t::key_signature_t>_>
               .super__Head_base<0UL,_intel_acbp_v2_t::key_signature_t_*,_false>._M_head_impl;
      (this->m_key_signature)._M_t.
      super___uniq_ptr_impl<intel_acbp_v2_t::key_signature_t,_std::default_delete<intel_acbp_v2_t::key_signature_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_intel_acbp_v2_t::key_signature_t_*,_std::default_delete<intel_acbp_v2_t::key_signature_t>_>
      .super__Head_base<0UL,_intel_acbp_v2_t::key_signature_t_*,_false>._M_head_impl = this_01;
      if (pkVar2 != (key_signature_t *)0x0) {
        (**(code **)((long)(pkVar2->super_kstruct)._vptr_kstruct + 8))();
      }
      return;
    }
    this_04 = (validation_not_equal_error<unsigned_short> *)__cxa_allocate_exception(0x48);
    local_a0._M_head_impl._0_2_ = 0x14;
    local_98 = CONCAT62(local_98._2_6_,this->m_total_size);
    pkVar3 = (this->super_kstruct).m__io;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/seq/3","");
    kaitai::validation_not_equal_error<unsigned_short>::validation_not_equal_error
              (this_04,(unsigned_short *)&local_a0,(unsigned_short *)&local_98,pkVar3,&local_90);
    __cxa_throw(this_04,&kaitai::validation_not_equal_error<unsigned_short>::typeinfo,
                kaitai::kstruct_error::~kstruct_error);
  }
  this_03 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
  local_a0._M_head_impl._0_1_ = this->m_version;
  pkVar3 = (this->super_kstruct).m__io;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/seq/1","");
  kaitai::validation_expr_error<unsigned_char>::validation_expr_error
            (this_03,(uchar *)&local_a0,pkVar3,&local_70);
  __cxa_throw(this_03,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
              kaitai::kstruct_error::~kstruct_error);
}

Assistant:

void intel_acbp_v2_t::_read() {
    m_structure_id = static_cast<intel_acbp_v2_t::structure_ids_t>(m__io->read_u8le());
    if (!(structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_ACBP)) {
        throw kaitai::validation_not_equal_error<intel_acbp_v2_t::structure_ids_t>(intel_acbp_v2_t::STRUCTURE_IDS_ACBP, structure_id(), _io(), std::string("/seq/0"));
    }
    m_version = m__io->read_u1();
    {
        uint8_t _ = version();
        if (!(_ >= 32)) {
            throw kaitai::validation_expr_error<uint8_t>(version(), _io(), std::string("/seq/1"));
        }
    }
    m_header_specific = m__io->read_u1();
    m_total_size = m__io->read_u2le();
    if (!(total_size() == 20)) {
        throw kaitai::validation_not_equal_error<uint16_t>(20, total_size(), _io(), std::string("/seq/3"));
    }
    m_key_signature_offset = m__io->read_u2le();
    m_bpm_revision = m__io->read_u1();
    m_bp_svn = m__io->read_u1();
    m_acm_svn = m__io->read_u1();
    m_reserved = m__io->read_u1();
    m_nem_data_size = m__io->read_u2le();
    m_elements = std::unique_ptr<std::vector<std::unique_ptr<acbp_element_t>>>(new std::vector<std::unique_ptr<acbp_element_t>>());
    {
        int i = 0;
        acbp_element_t* _;
        do {
            _ = new acbp_element_t(m__io, this, m__root);
            m_elements->push_back(std::move(std::unique_ptr<acbp_element_t>(_)));
            i++;
        } while (!( ((_->header()->total_size() == 0) || (_->header()->structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_PMSG)) ));
    }
    m_key_signature = std::unique_ptr<key_signature_t>(new key_signature_t(m__io, this, m__root));
}